

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourcesGL::LoadUniforms(ShaderResourcesGL *this,LoadUniformsAttribs *Attribs)

{
  ushort *puVar1;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *this_00;
  vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
  *this_01;
  pointer pvVar2;
  char (*pacVar3) [30];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  GLuint GVar5;
  pointer pSVar6;
  void *ptr;
  undefined8 uVar7;
  pointer pcVar8;
  pointer pUVar9;
  pointer pSVar10;
  pointer RangeStart;
  pointer RangeEnd;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  GLuint GVar15;
  uint uVar16;
  size_t sVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  ShaderCodeVariableDescX *this_02;
  ShaderCodeVariableDescX *pSVar21;
  IMemoryAllocator *RawAllocator;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  *Images_00;
  char (*Args_1) [29];
  ulong uVar22;
  ShaderCodeVariableDescX *pSVar23;
  long lVar24;
  GLProgramObj *GLProgram;
  char (*pacVar25) [30];
  iterator __begin5_1;
  GLuint GVar26;
  iterator __begin5;
  size_t sVar27;
  char *pcVar28;
  pointer pSVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar34;
  bool IsMS;
  RESOURCE_DIMENSION ResDim;
  GLenum err;
  GLint size;
  string msg;
  GLenum dataType;
  SHADER_RESOURCE_TYPE ResourceType;
  vector<char,_std::allocator<char>_> Name;
  PIPELINE_RESOURCE_FLAGS ResourceFlags;
  GLint NameLen;
  GLint numActiveShaderStorageBlocks;
  GLenum err_4;
  GLint activeUniformBlockMaxLength;
  GLint numActiveUniformBlocks;
  GLint numActiveUniforms;
  GLenum err_7;
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  UniformVars;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  UniformBlocks;
  GLint activeUniformMaxLength;
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  StorageBlocks;
  GLenum err_9;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  Images;
  vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  Textures;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  NamesPool;
  bool local_2da;
  RESOURCE_DIMENSION local_2d9;
  undefined1 local_2d8 [20];
  Uint32 UStack_2c4;
  undefined8 local_2c0;
  ShaderCodeVariableDesc *pSStack_2b8;
  uint local_2a4;
  ShaderCodeVariableDescX *local_2a0;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  pointer local_278;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  local_230;
  ShaderCodeVariableDescX *local_210;
  char *local_208;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  string local_1f8;
  vector<char,_std::allocator<char>_> local_1d8;
  string local_1c0;
  GLsizei local_1a0;
  GLint local_19c;
  ShaderCodeBufferDescX local_198;
  uint local_164;
  GLint local_160;
  GLint local_15c;
  long *local_158 [2];
  long local_148 [2];
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  local_138;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  local_118;
  ShaderResourcesGL *local_f8;
  uint local_f0;
  uint local_ec;
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  local_e8;
  vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_> local_c8
  ;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  local_a8;
  vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  local_88;
  char *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_f8 = this;
  if ((Attribs->SamplerResourceFlag & ~PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) !=
      PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[100]>
              ((string *)local_298,
               (char (*) [100])
               "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags"
              );
    DebugAssertionFailed
              ((Char *)local_298._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1c8);
    if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
  }
  local_118.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_138.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  GLProgram = Attribs->GLProgram;
  if (GLProgram->m_uiHandle == 0) {
    FormatString<char[16]>((string *)local_298,(char (*) [16])"Null GL program");
    DebugAssertionFailed
              ((Char *)local_298._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1d6);
    if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
    GLProgram = Attribs->GLProgram;
  }
  GLContextState::SetProgram(Attribs->State,GLProgram);
  GVar5 = Attribs->GLProgram->m_uiHandle;
  local_f8->m_ShaderStages = Attribs->ShaderStages;
  local_15c = 0;
  (*__glewGetProgramiv)(GVar5,0x8b86,&local_15c);
  local_2d8._0_4_ = glGetError();
  if (local_2d8._0_4_ != 0) {
    LogError<false,char[45],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de,(char (*) [45])"Unable to get the number of active uniforms\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
    FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              ((Char *)local_298._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de);
    if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
  }
  local_ec = 0;
  (*__glewGetProgramiv)(GVar5,0x8b87,(GLint *)&local_ec);
  local_2d8._0_4_ = glGetError();
  if (local_2d8._0_4_ != 0) {
    LogError<false,char[47],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3,(char (*) [47])"Unable to get the maximum uniform name length\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
    FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              ((Char *)local_298._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3);
    if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
  }
  local_160 = 0;
  (*__glewGetProgramiv)(GVar5,0x8a36,&local_160);
  local_2d8._0_4_ = glGetError();
  if (local_2d8._0_4_ != 0) {
    LogError<false,char[51],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7,(char (*) [51])"Unable to get the number of active uniform blocks\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
    FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              ((Char *)local_298._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7);
    if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
  }
  local_164 = 0;
  (*__glewGetProgramiv)(GVar5,0x8a35,(GLint *)&local_164);
  iVar11 = glGetError();
  if (iVar11 != 0) {
    FormatString<char[53]>
              ((string *)local_298,
               (char (*) [53])"Unable to get the maximum uniform block name length.");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_298._0_8_,0,0,0);
    }
    if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
  }
  if ((int)local_164 < 1) {
    local_164 = 0x400;
  }
  uVar16 = local_164;
  if ((int)local_164 < (int)local_ec) {
    uVar16 = local_ec;
  }
  pSVar23 = (ShaderCodeVariableDescX *)(ulong)uVar16;
  local_19c = 0;
  if (__glewGetProgramInterfaceiv != (PFNGLGETPROGRAMINTERFACEIVPROC)0x0) {
    (*__glewGetProgramInterfaceiv)(GVar5,0x92e6,0x92f5,&local_19c);
    uVar12 = glGetError();
    if (uVar12 != 0) {
      local_2d8._0_4_ = uVar12;
      LogError<false,char[51],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201,(char (*) [51])"Unable to get the number of shader storage blocks\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
      FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
      DebugAssertionFailed
                ((Char *)local_298._0_8_,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201);
      if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
    }
    local_2d8._0_8_ = (ulong)(uint)local_2d8._4_4_ << 0x20;
    (*__glewGetProgramInterfaceiv)(GVar5,0x92e6,0x92f6,(GLint *)local_2d8);
    local_198.super_ShaderCodeBufferDesc.Size = glGetError();
    if (local_198.super_ShaderCodeBufferDesc.Size != 0) {
      LogError<false,char[60],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206,(char (*) [60])
                        "Unable to get the maximum shader storage block name length\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)&local_198);
      FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
      DebugAssertionFailed
                ((Char *)local_298._0_8_,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206);
      if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
    }
    pSVar23 = (ShaderCodeVariableDescX *)(ulong)uVar16;
    if ((int)uVar16 <= (int)local_2d8._0_4_) {
      pSVar23 = (ShaderCodeVariableDescX *)(local_2d8._0_8_ & 0xffffffff);
    }
  }
  local_210 = (ShaderCodeVariableDescX *)0x200;
  if (0x200 < (uint)pSVar23) {
    local_210 = pSVar23;
  }
  local_2a0 = (ShaderCodeVariableDescX *)Attribs;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_1d8,(ulong)((int)local_210 + 1),(allocator_type *)local_298);
  if (0 < local_15c) {
    GVar26 = 0;
    do {
      local_200._M_current = local_200._M_current & 0xffffffff00000000;
      local_2a4 = 0;
      local_1a0 = 0;
      (*__glewGetActiveUniform)
                (GVar5,GVar26,(GLsizei)local_210,&local_1a0,(GLint *)&local_2a4,(GLenum *)&local_200
                 ,local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      iVar11 = glGetError();
      local_2d8._0_4_ = iVar11;
      if (iVar11 != 0) {
        LogError<false,char[30],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x218,(char (*) [30])"Unable to get active uniform\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x218);
        if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
      }
      sVar27 = (size_t)local_1a0;
      if (((int)local_210 <= local_1a0) ||
         (sVar17 = strlen(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start), sVar17 != sVar27)) {
        FormatString<char[23]>((string *)local_298,(char (*) [23])"Incorrect uniform name");
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x219);
        if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
      }
      if ((int)local_2a4 < 1) {
        FormatString<char[34]>
                  ((string *)local_298,(char (*) [34])"Size is expected to be at least 1");
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x21a);
        if ((char (*) [30])local_298._0_8_ != (char (*) [30])(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
      }
      GLTextureTypeToResourceDim((GLenum)local_200._M_current,&local_2d9,&local_2da);
      pcVar8 = local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)(GLenum)local_200._M_current < 0x900c) {
        if (((((GLenum)local_200._M_current - 0x8dc0 < 0x19) &&
             ((0x1dfde3fU >> ((GLenum)local_200._M_current - 0x8dc0 & 0x1f) & 1) != 0)) ||
            ((GLenum)local_200._M_current - 0x8b5d < 6)) || ((GLenum)local_200._M_current == 0x8d66)
           ) goto LAB_002ff179;
LAB_002ff317:
        if (*(bool *)&(local_2a0->super_ShaderCodeVariableDesc).ArraySize == true) {
          GLDataTypeToShaderCodeVariableDesc
                    ((ShaderCodeVariableDesc *)local_298,(GLenum)local_200._M_current);
          if (local_288._M_local_buf[1] != '\0') {
            local_298._0_8_ =
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_208 = (char *)CONCAT44(local_208._4_4_,
                                         (local_2a0->super_ShaderCodeVariableDesc).NumMembers);
            local_198.super_ShaderCodeBufferDesc.Size = GVar26;
            local_1f8._M_dataplus._M_p._0_4_ = 0xffffffff;
            (*__glewGetActiveUniformsiv)(GVar5,1,(GLuint *)&local_198,0x8a3a,(GLint *)&local_1f8);
            iVar11 = glGetError();
            local_1c0._M_dataplus._M_p._0_4_ = iVar11;
            if (iVar11 != 0) {
              LogError<false,char[51],unsigned_int,char[17],unsigned_int>
                        (false,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0xde,(char (*) [51])"Failed to get the uniform block index for uniform ",
                         (uint *)&local_198,(char (*) [17])"\nGL Error Code: ",(uint *)&local_1c0);
              FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x8506c9);
              DebugAssertionFailed
                        ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0xde);
              if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
              }
            }
            uVar20 = (ulong)local_1f8._M_dataplus._M_p & 0xffffffff;
            if (-1 < (int)(GLuint)local_1f8._M_dataplus._M_p) {
              uVar22 = ((long)local_138.
                              super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              if (uVar22 < uVar20 || uVar22 - uVar20 == 0) {
                std::
                vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                ::resize(&local_138,uVar20 + 1);
              }
              this_01 = (vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                         *)(local_138.
                            super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           (int)(GLuint)local_1f8._M_dataplus._M_p);
              std::
              vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
              ::emplace_back<Diligent::ShaderCodeVariableDesc_const&>
                        (this_01,(ShaderCodeVariableDesc *)local_298);
              lVar24 = *(long *)(this_01 + 8);
              if ((int)local_208 == 1) {
                if (*(char *)(lVar24 + -0x70) == '\x02') {
                  puVar1 = (ushort *)(lVar24 + -0x6e);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                }
                ShaderCodeVariableDescX::SetDefaultTypeName
                          ((ShaderCodeVariableDescX *)(lVar24 + -0x80),SHADER_SOURCE_LANGUAGE_HLSL);
              }
              if ((byte)(*(char *)(lVar24 + -0x70) - 3U) < 2) {
                local_1c0._M_dataplus._M_p._0_4_ = 0xffffffff;
                (*__glewGetActiveUniformsiv)
                          (GVar5,1,(GLuint *)&local_198,0x8a3e,(GLint *)&local_1c0);
                iVar11 = glGetError();
                local_158[0] = (long *)CONCAT44(local_158[0]._4_4_,iVar11);
                if (iVar11 != 0) {
                  LogError<false,char[65],char[17],unsigned_int>
                            (false,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0xfc,(char (*) [65])
                                   "Failed to get the value of the GL_UNIFORM_IS_ROW_MAJOR parameter"
                             ,(char (*) [17])"\nGL Error Code: ",(uint *)local_158);
                  FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x8506c9);
                  DebugAssertionFailed
                            ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0xfc);
                  if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                    operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                  }
                }
                if (-1 < (int)local_1c0._M_dataplus._M_p) {
                  *(char *)(lVar24 + -0x70) = ((int)local_1c0._M_dataplus._M_p == 0) + '\x03';
                }
              }
              local_1c0._M_dataplus._M_p._0_4_ = 0xffffffff;
              (*__glewGetActiveUniformsiv)(GVar5,1,(GLuint *)&local_198,0x8a3c,(GLint *)&local_1c0);
              iVar11 = glGetError();
              local_158[0]._0_4_ = iVar11;
              if (iVar11 != 0) {
                LogError<false,char[65],char[17],unsigned_int>
                          (false,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x10a,(char (*) [65])
                                  "Failed to get the value of the GL_UNIFORM_ARRAY_STRIDE parameter"
                           ,(char (*) [17])"\nGL Error Code: ",(uint *)local_158);
                FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x8506c9);
                DebugAssertionFailed
                          ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x10a);
                if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                  operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                }
              }
              if (0 < (int)local_1c0._M_dataplus._M_p) {
                local_158[0]._0_4_ = -1;
                (*__glewGetActiveUniformsiv)(GVar5,1,(GLuint *)&local_198,0x8a38,(GLint *)local_158)
                ;
                iVar11 = glGetError();
                local_c8.
                super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_c8.
                                       super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar11);
                if (iVar11 != 0) {
                  LogError<false,char[57],char[17],unsigned_int>
                            (false,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0x110,(char (*) [57])
                                    "Failed to get the value of the GL_UNIFORM_SIZE parameter",
                             (char (*) [17])"\nGL Error Code: ",(uint *)&local_c8);
                  FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x8506c9);
                  DebugAssertionFailed
                            ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0x110);
                  if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                    operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                  }
                }
                if (0 < (int)local_158[0]) {
                  *(int *)(lVar24 + -0x68) = (int)local_158[0];
                }
              }
              local_1c0._M_dataplus._M_p._0_4_ = 0xffffffff;
              (*__glewGetActiveUniformsiv)(GVar5,1,(GLuint *)&local_198,0x8a3b,(GLint *)&local_1c0);
              iVar11 = glGetError();
              local_158[0] = (long *)CONCAT44(local_158[0]._4_4_,iVar11);
              if (iVar11 != 0) {
                LogError<false,char[59],char[17],unsigned_int>
                          (false,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x11a,(char (*) [59])
                                  "Failed to get the value of the GL_UNIFORM_OFFSET parameter",
                           (char (*) [17])"\nGL Error Code: ",(uint *)local_158);
                FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x8506c9);
                DebugAssertionFailed
                          ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x11a);
                if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                  operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                }
              }
              if (-1 < (int)local_1c0._M_dataplus._M_p) {
                *(int *)(lVar24 + -0x6c) = (int)local_1c0._M_dataplus._M_p;
              }
            }
          }
        }
      }
      else if ((GLenum)local_200._M_current - 0x904c < 0x21) {
        if (((GLenum)local_200._M_current - 0x9051 < 0x17) &&
           ((0x400801U >> ((GLenum)local_200._M_current - 0x9051 & 0x1f) & 1) != 0)) {
          local_1f8._M_dataplus._M_p._0_1_ = 5;
          local_1c0._M_dataplus._M_p._0_1_ = 4;
        }
        else {
          local_1f8._M_dataplus._M_p._0_1_ = 4;
          local_1c0._M_dataplus._M_p._0_1_ = 0;
        }
        pcVar18 = strchr(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,0x5b);
        local_2d8._0_8_ = pcVar8;
        if (pcVar18 != (char *)0x0) {
          *pcVar18 = '\0';
          local_2d8._0_8_ =
               local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        pVar34 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        local_298._0_8_ =
             *(long *)((long)pVar34.first.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      + 8);
        local_198.super_ShaderCodeBufferDesc.Size = local_2a4;
        std::
        vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                  ((vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
                    *)&local_a8,(char **)local_298,(SHADER_TYPE *)local_2a0,
                   (SHADER_RESOURCE_TYPE *)&local_1f8,(PIPELINE_RESOURCE_FLAGS *)&local_1c0,
                   (uint *)&local_198,(uint *)&local_200,&local_2d9,&local_2da);
      }
      else {
        if ((5 < (GLenum)local_200._M_current - 0x9108) &&
           (3 < (GLenum)local_200._M_current - 0x900c)) goto LAB_002ff317;
LAB_002ff179:
        if (((GLenum)local_200._M_current - 0x8dc2 < 0x17) &&
           ((0x404001U >> ((GLenum)local_200._M_current - 0x8dc2 & 0x1f) & 1) != 0)) {
          local_1f8._M_dataplus._M_p._0_1_ = 3;
          local_1c0._M_dataplus._M_p._0_1_ = PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER;
        }
        else {
          local_1f8._M_dataplus._M_p._0_1_ = 2;
          local_1c0._M_dataplus._M_p._0_1_ =
               *(PIPELINE_RESOURCE_FLAGS *)
                ((long)&(local_2a0->super_ShaderCodeVariableDesc).Name + 4);
        }
        pcVar18 = strchr(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,0x5b);
        local_2d8._0_8_ = pcVar8;
        if (pcVar18 != (char *)0x0) {
          *pcVar18 = '\0';
          local_2d8._0_8_ =
               local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        pVar34 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        local_298._0_8_ =
             *(long *)((long)pVar34.first.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      + 8);
        local_198.super_ShaderCodeBufferDesc.Size = local_2a4;
        std::
        vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                  ((vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
                    *)&local_88,(char **)local_298,(SHADER_TYPE *)local_2a0,
                   (SHADER_RESOURCE_TYPE *)&local_1f8,(PIPELINE_RESOURCE_FLAGS *)&local_1c0,
                   (uint *)&local_198,(uint *)&local_200,&local_2d9,&local_2da);
      }
      GVar26 = GVar26 + 1;
    } while ((int)GVar26 < local_15c);
  }
  pSVar23 = local_2a0;
  if (0 < local_160) {
    pacVar3 = (char (*) [30])(local_298 + 0x10);
    GVar26 = 0;
    do {
      local_198.super_ShaderCodeBufferDesc._0_8_ =
           local_198.super_ShaderCodeBufferDesc._0_8_ & 0xffffffff00000000;
      pcVar18 = local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*__glewGetActiveUniformBlockName)
                (GVar5,GVar26,(GLsizei)local_210,(GLsizei *)&local_198,
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar11 = glGetError();
      local_2d8._0_4_ = iVar11;
      if (iVar11 != 0) {
        pcVar18 = "Unable to get active uniform block name\n";
        LogError<false,char[41],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2c8,(char (*) [41])"Unable to get active uniform block name\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2c8);
        if ((char (*) [30])local_298._0_8_ != pacVar3) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
      }
      pacVar25 = (char (*) [30])
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      sVar27 = (size_t)(int)local_198.super_ShaderCodeBufferDesc.Size;
      if (((int)local_210 <= (int)local_198.super_ShaderCodeBufferDesc.Size) ||
         (sVar17 = strlen(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start), sVar17 != sVar27)) {
        FormatString<char[29]>((string *)local_298,(char (*) [29])"Incorrect uniform block name");
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2c9);
        pacVar25 = (char (*) [30])
                   local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((char (*) [30])local_298._0_8_ != pacVar3) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
          pacVar25 = (char (*) [30])
                     local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
      }
      local_208 = (char *)CONCAT44(local_208._4_4_,GVar26);
      GVar26 = (*__glewGetUniformBlockIndex)(GVar5,*pacVar25);
      local_1f8._M_dataplus._M_p._0_4_ = GVar26;
      iVar11 = glGetError();
      local_2d8._0_4_ = iVar11;
      if (iVar11 != 0) {
        pcVar18 = "Unable to get active uniform block index\n";
        LogError<false,char[42],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2d0,(char (*) [42])"Unable to get active uniform block index\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2d0);
        if ((char (*) [30])local_298._0_8_ != pacVar3) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
      }
      pacVar25 = (char (*) [30])
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar19 = strchr(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,0x5b);
      if (pcVar19 == (char *)0x0) {
        iVar11 = 1;
LAB_002ffada:
        local_2d8._0_8_ = pacVar25;
        pVar34 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        local_298._0_8_ =
             *(long *)((long)pVar34.first.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      + 8);
        local_158[0] = (long *)CONCAT71(local_158[0]._1_7_,1);
        local_1c0._M_dataplus._M_p._0_4_ = iVar11;
        std::
        vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                  ((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
                    *)&local_118,(char **)local_298,(SHADER_TYPE *)pSVar23,
                   (SHADER_RESOURCE_TYPE *)local_158,(uint *)&local_1c0,(uint *)&local_1f8);
        iVar11 = (int)local_208;
      }
      else {
        iVar13 = atoi(pcVar19 + 1);
        pUVar9 = local_118.
                 super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar28 = (char *)local_118.
                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        iVar11 = 0;
        if (0 < iVar13) {
          iVar11 = iVar13;
        }
        iVar11 = iVar11 + 1;
        *pcVar19 = '\0';
        pacVar25 = (char (*) [30])
                   local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pSVar23 = local_2a0;
        if (local_118.
            super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_118.
            super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ffada;
        iVar14 = strcmp(*(char **)*(char (*) [30])
                                   ((long)local_118.
                                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + -0x18),
                        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pSVar23 = local_2a0;
        if (iVar14 != 0) {
          do {
            iVar13 = strcmp(*(char **)pcVar28,
                            local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            if (iVar13 == 0) {
              FormatString<char[30],char_const*,char[30]>
                        ((string *)local_298,(Diligent *)"Uniform block with the name \'",
                         (char (*) [30])pcVar28,(char **)"\' has already been enumerated",
                         (char (*) [30])pcVar18);
              DebugAssertionFailed
                        ((Char *)local_298._0_8_,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x2ed);
              if ((char (*) [30])local_298._0_8_ != pacVar3) {
                operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
              }
            }
            pcVar28 = pcVar28 + 0x18;
            pacVar25 = (char (*) [30])
                       local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pSVar23 = local_2a0;
          } while ((pointer)pcVar28 != pUVar9);
          goto LAB_002ffada;
        }
        iVar14 = *(int *)((long)pUVar9 + -8);
        if (*(int *)((long)pUVar9 + -8) < iVar11) {
          iVar14 = iVar11;
        }
        iVar11 = (int)local_208;
        if ((GLuint)local_1f8._M_dataplus._M_p != iVar13 + *(int *)((long)pUVar9 + -4)) {
          FormatString<char[52]>
                    ((string *)local_298,
                     (char (*) [52])"Uniform block indices are expected to be continuous");
          DebugAssertionFailed
                    ((Char *)local_298._0_8_,"LoadUniforms",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x2e5);
          if ((char (*) [30])local_298._0_8_ != pacVar3) {
            operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
          }
        }
        *(int *)((long)pUVar9 + -8) = iVar14;
      }
      GVar26 = iVar11 + 1;
    } while ((int)GVar26 < local_160);
  }
  if (0 < local_19c) {
    pacVar3 = (char (*) [30])(local_298 + 0x10);
    GVar26 = 0;
    do {
      local_198.super_ShaderCodeBufferDesc._0_8_ =
           local_198.super_ShaderCodeBufferDesc._0_8_ & 0xffffffff00000000;
      pcVar18 = (char *)&local_198;
      (*__glewGetProgramResourceName)
                (GVar5,0x92e6,GVar26,(GLsizei)local_210,(GLsizei *)pcVar18,
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar11 = glGetError();
      local_2d8._0_4_ = iVar11;
      if (iVar11 != 0) {
        pcVar18 = "Unable to get shader storage block name\n";
        LogError<false,char[41],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x304,(char (*) [41])"Unable to get shader storage block name\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x304);
        if ((char (*) [30])local_298._0_8_ != pacVar3) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
      }
      pacVar25 = (char (*) [30])
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      sVar27 = (size_t)(int)local_198.super_ShaderCodeBufferDesc.Size;
      if (((int)local_210 <= (int)local_198.super_ShaderCodeBufferDesc.Size) ||
         (sVar17 = strlen(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start), sVar17 != sVar27)) {
        FormatString<char[36]>
                  ((string *)local_298,(char (*) [36])"Incorrect shader storage block name");
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x305);
        pacVar25 = (char (*) [30])
                   local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((char (*) [30])local_298._0_8_ != pacVar3) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
          pacVar25 = (char (*) [30])
                     local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
      }
      GVar15 = (*__glewGetProgramResourceIndex)(GVar5,0x92e6,*pacVar25);
      local_1f8._M_dataplus._M_p._0_4_ = GVar15;
      iVar11 = glGetError();
      local_2d8._0_4_ = iVar11;
      if (iVar11 != 0) {
        pcVar18 = "Unable to get shader storage block index\n";
        LogError<false,char[42],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x308,(char (*) [42])"Unable to get shader storage block index\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
        DebugAssertionFailed
                  ((Char *)local_298._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x308);
        if ((char (*) [30])local_298._0_8_ != pacVar3) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
      }
      pacVar25 = (char (*) [30])
                 local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_208 = (char *)CONCAT44(local_208._4_4_,GVar26);
      pcVar19 = strchr(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,0x5b);
      if (pcVar19 == (char *)0x0) {
        iVar11 = 1;
LAB_002ffeb0:
        local_2d8._0_8_ = pacVar25;
        pVar34 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        pSVar23 = local_2a0;
        local_298._0_8_ =
             *(long *)((long)pVar34.first.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      + 8);
        local_158[0] = (long *)CONCAT71(local_158[0]._1_7_,5);
        local_1c0._M_dataplus._M_p._0_4_ = iVar11;
        std::
        vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                  ((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
                    *)&local_e8,(char **)local_298,(SHADER_TYPE *)local_2a0,
                   (SHADER_RESOURCE_TYPE *)local_158,(uint *)&local_1c0,(uint *)&local_1f8);
      }
      else {
        iVar13 = atoi(pcVar19 + 1);
        pSVar10 = local_e8.
                  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pcVar28 = (char *)local_e8.
                          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        iVar11 = 0;
        if (0 < iVar13) {
          iVar11 = iVar13;
        }
        iVar11 = iVar11 + 1;
        *pcVar19 = '\0';
        pacVar25 = (char (*) [30])
                   local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (local_e8.
            super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_e8.
            super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ffeb0;
        iVar14 = strcmp(*(char **)*(char (*) [30])
                                   ((long)local_e8.
                                          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + -0x18),
                        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pSVar23 = local_2a0;
        if (iVar14 != 0) {
          do {
            iVar13 = strcmp(*(char **)pcVar28,
                            local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            if (iVar13 == 0) {
              FormatString<char[30],char_const*,char[30]>
                        ((string *)local_298,(Diligent *)"Storage block with the name \"",
                         (char (*) [30])pcVar28,(char **)"\" has already been enumerated",
                         (char (*) [30])pcVar18);
              DebugAssertionFailed
                        ((Char *)local_298._0_8_,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x321);
              if ((char (*) [30])local_298._0_8_ != pacVar3) {
                operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
              }
            }
            pcVar28 = pcVar28 + 0x18;
            pacVar25 = (char (*) [30])
                       local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while ((pointer)pcVar28 != pSVar10);
          goto LAB_002ffeb0;
        }
        iVar14 = *(int *)((long)pSVar10 + -8);
        if (*(int *)((long)pSVar10 + -8) < iVar11) {
          iVar14 = iVar11;
        }
        if ((GLuint)local_1f8._M_dataplus._M_p != iVar13 + *(int *)((long)pSVar10 + -4)) {
          FormatString<char[52]>
                    ((string *)local_298,
                     (char (*) [52])"Storage block indices are expected to be continuous");
          DebugAssertionFailed
                    ((Char *)local_298._0_8_,"LoadUniforms",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x319);
          if ((char (*) [30])local_298._0_8_ != pacVar3) {
            operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
          }
        }
        *(int *)((long)pSVar10 + -8) = iVar14;
      }
      GVar26 = (int)local_208 + 1;
    } while ((int)GVar26 < local_19c);
  }
  local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
  local_298._8_8_ = (ulong)(uint)local_298._12_4_ << 0x20;
  GLContextState::SetProgram
            (*(GLContextState **)&(pSVar23->super_ShaderCodeVariableDesc).Class,
             (GLProgramObj *)local_298);
  if (local_298._0_4_ != 0) {
    (*__glewDeleteProgram)(local_298._0_4_);
  }
  Images_00 = &local_a8;
  pcVar18 = (char *)&local_e8;
  AllocateResources(local_f8,&local_118,&local_88,Images_00,
                    (vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                     *)pcVar18);
  if (local_138.
      super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (*(bool *)&(pSVar23->super_ShaderCodeVariableDesc).ArraySize == false) {
      FormatString<char[26],char[36]>
                ((string *)local_298,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Attribs.LoadUniformBufferReflection",(char (*) [36])Images_00);
      DebugAssertionFailed
                ((Char *)local_298._0_8_,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x33a);
      if ((IMemoryAllocator *)local_298._0_8_ != (IMemoryAllocator *)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
    }
    local_c8.
    super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
    ._M_impl.super__Vector_impl_data._M_start = (ShaderCodeBufferDescX *)0x0;
    local_c8.
    super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
    ._M_impl.super__Vector_impl_data._M_finish = (ShaderCodeBufferDescX *)0x0;
    local_c8.
    super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208 = (char *)local_118.
                        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    if (local_118.
        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_118.
        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar4 = &local_1f8.field_2;
      pcVar19 = (char *)local_118.
                        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      do {
        pvVar2 = local_138.
                 super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = (ulong)*(uint *)(pcVar19 + 0x14);
        uVar20 = ((long)local_138.
                        super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_138.
                        super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar20 < uVar22 || uVar20 - uVar22 == 0) {
          FormatString<char[15],unsigned_int,char[19]>
                    ((string *)local_298,(Diligent *)"Uniform block ",
                     (char (*) [15])(pcVar19 + 0x14),(uint *)" has no variables.",
                     (char (*) [19])pcVar18);
          DebugAssertionFailed
                    ((Char *)local_298._0_8_,"LoadUniforms",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x34b);
          if ((IMemoryAllocator *)local_298._0_8_ != (IMemoryAllocator *)(local_298 + 0x10)) {
            operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
          }
        }
        else {
          local_2a4 = 0;
          (*__glewGetActiveUniformBlockiv)
                    (GVar5,*(uint *)(pcVar19 + 0x14),0x8a40,(GLint *)&local_2a4);
          iVar11 = glGetError();
          local_2d8._0_4_ = iVar11;
          if (iVar11 != 0) {
            pcVar18 = "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter";
            LogError<false,char[68],char[17],unsigned_int>
                      (false,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x345,(char (*) [68])
                              "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter",
                       (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
            FormatString<char[6]>((string *)local_298,(char (*) [6])0x8506c9);
            DebugAssertionFailed
                      ((Char *)local_298._0_8_,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x345);
            if ((IMemoryAllocator *)local_298._0_8_ != (IMemoryAllocator *)(local_298 + 0x10)) {
              operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
            }
          }
          pvVar2 = pvVar2 + uVar22;
          local_f0 = local_2a4;
          pSVar29 = (pvVar2->
                    super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pSVar6 = (pvVar2->
                   super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_70 = pcVar19;
          if (pSVar29 != pSVar6) {
            uVar20 = (long)pSVar6 - (long)pSVar29 >> 7;
            lVar24 = 0x3f;
            if (uVar20 != 0) {
              for (; uVar20 >> lVar24 == 0; lVar24 = lVar24 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                      (pSVar29,pSVar6,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
            if ((long)pSVar6 - (long)pSVar29 < 0x801) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                        (pSVar29);
            }
            else {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                        (pSVar29);
              for (pSVar29 = pSVar29 + 0x10; pSVar29 != pSVar6; pSVar29 = pSVar29 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Val_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                          (pSVar29);
              }
            }
          }
          uVar30 = 0;
          uVar31 = 0;
          uVar32 = 0;
          uVar33 = 0;
          local_288._M_allocated_capacity = 0;
          local_288._8_8_ = 0;
          local_298._0_8_ = (IMemoryAllocator *)0x0;
          local_298._8_8_ = (ShaderCodeVariableDesc *)0x0;
          Args_1 = (char (*) [29])0x0;
          local_278 = (pointer)0x0;
          local_270._M_p = (pointer)&local_260;
          local_268 = 0;
          local_260._M_local_buf[0] = '\0';
          local_250._M_p = (pointer)&local_240;
          local_248 = 0;
          local_240._M_local_buf[0] = '\0';
          local_230.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_230.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_230.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pSVar23 = (pvVar2->
                    super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_2a0 = (pvVar2->
                      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar23 == local_2a0) {
            local_198.Variables.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          else {
            do {
              pcVar19 = (pSVar23->super_ShaderCodeVariableDesc).Name;
              local_210 = pSVar23;
              pcVar28 = strchr(pcVar19,0x2e);
              if (pcVar28 == (char *)0x0) {
                this_02 = (ShaderCodeVariableDescX *)local_298;
              }
              else {
                pSVar23 = (ShaderCodeVariableDescX *)local_298;
                do {
                  local_1f8._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1f8,pcVar19,pcVar28);
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  local_1c0._M_string_length = 0;
                  local_1c0.field_2._M_local_buf[0] = '\0';
                  local_2d8._0_8_ = local_1f8._M_dataplus._M_p;
                  local_200._M_current = local_1f8._M_dataplus._M_p + local_1f8._M_string_length;
                  iVar11 = Parsing::
                           GetArrayIndex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                     ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_2d8,&local_200,&local_1c0);
                  this_02 = ShaderCodeVariableDescX::FindMember(pSVar23,local_1c0._M_dataplus._M_p);
                  if (this_02 == (ShaderCodeVariableDescX *)0x0) {
                    local_2c0 = 0;
                    pSStack_2b8 = (ShaderCodeVariableDesc *)0x0;
                    local_2d8._8_8_ = (pointer)0x0;
                    local_2d8._0_8_ = local_1c0._M_dataplus._M_p;
                    UStack_2c4 = (local_210->super_ShaderCodeVariableDesc).Offset;
                    local_2d8._16_4_ = 5;
                    pSVar29 = (pSVar23->Members).
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pSVar6 = (pSVar23->Members).
                             super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    std::
                    vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                    ::emplace_back<Diligent::ShaderCodeVariableDesc_const&>
                              ((vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                                *)&pSVar23->Members,(ShaderCodeVariableDesc *)local_2d8);
                    lVar24 = (long)pSVar6 - (long)pSVar29;
                    pSVar29 = (pSVar23->Members).
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    (pSVar23->super_ShaderCodeVariableDesc).NumMembers =
                         (Uint32)((ulong)((long)(pSVar23->Members).
                                                super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pSVar29) >> 7);
                    (pSVar23->super_ShaderCodeVariableDesc).pMembers =
                         &pSVar29->super_ShaderCodeVariableDesc;
                    this_02 = (ShaderCodeVariableDescX *)((long)pSVar29 + lVar24);
                    uVar16 = *(uint *)((long)pSVar29 + lVar24 + 0x18);
                    Args_1 = (char (*) [29])(ulong)uVar16;
                    uVar12 = iVar11 + 1U;
                    if (iVar11 + 1U < uVar16) {
                      uVar12 = uVar16;
                    }
                    *(uint *)((long)pSVar29 + lVar24 + 0x18) = uVar12;
                  }
                  else {
                    uVar16 = (this_02->super_ShaderCodeVariableDesc).ArraySize;
                    uVar12 = iVar11 + 1U;
                    if (iVar11 + 1U < uVar16) {
                      uVar12 = uVar16;
                    }
                    (this_02->super_ShaderCodeVariableDesc).ArraySize = uVar12;
                    if ((local_210->super_ShaderCodeVariableDesc).Offset <
                        (this_02->super_ShaderCodeVariableDesc).Offset) {
                      FormatString<char[26],char[27]>
                                ((string *)local_2d8,(Diligent *)"Debug expression failed:\n",
                                 (char (*) [26])"Var.Offset >= pVar->Offset",(char (*) [27])Args_1);
                      Args_1 = (char (*) [29])0x170;
                      DebugAssertionFailed
                                ((Char *)local_2d8._0_8_,"PrepareUBReflection",
                                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                                 ,0x170);
                      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                        operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                      }
                    }
                  }
                  pcVar19 = pcVar28 + 1;
                  pcVar28 = strchr(pcVar19,0x2e);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                             local_1c0.field_2._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != paVar4) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  pSVar23 = this_02;
                } while (pcVar28 != (char *)0x0);
              }
              local_2d8._0_8_ = local_2d8 + 0x10;
              local_2d8._8_8_ = (pointer)0x0;
              stack0xfffffffffffffd38 = stack0xfffffffffffffd38 & 0xffffffffffffff00;
              std::__cxx11::string::string((string *)&local_1f8,pcVar19,(allocator *)&local_1a0);
              local_1c0._M_dataplus._M_p = local_1f8._M_dataplus._M_p;
              local_200._M_current = local_1f8._M_dataplus._M_p + local_1f8._M_string_length;
              iVar11 = Parsing::
                       GetArrayIndex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_1c0,&local_200,(string *)local_2d8);
              pSVar23 = local_210;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != paVar4) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              pSVar21 = ShaderCodeVariableDescX::FindMember(this_02,(char *)local_2d8._0_8_);
              if (pSVar21 == (ShaderCodeVariableDescX *)0x0) {
                iVar13 = std::__cxx11::string::compare(local_2d8);
                if (iVar13 != 0) {
                  local_158[0] = local_148;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_158,local_2d8._0_8_,
                             (pointer)((long)&((ShaderCodeVariableDesc *)local_2d8._8_8_)->Name +
                                      local_2d8._0_8_));
                  std::__cxx11::string::operator=((string *)&pSVar23->NameCopy,(string *)local_158);
                  (pSVar23->super_ShaderCodeVariableDesc).Name =
                       (pSVar23->NameCopy)._M_dataplus._M_p;
                  if (local_158[0] != local_148) {
                    operator_delete(local_158[0],local_148[0] + 1);
                  }
                }
                uVar16 = (pSVar23->super_ShaderCodeVariableDesc).ArraySize;
                uVar12 = iVar11 + 1U;
                if (iVar11 + 1U < uVar16) {
                  uVar12 = uVar16;
                }
                (pSVar23->super_ShaderCodeVariableDesc).ArraySize = uVar12;
                std::
                vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                ::emplace_back<Diligent::ShaderCodeVariableDescX>(&this_02->Members,pSVar23);
                pSVar29 = (this_02->Members).
                          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                Args_1 = (char (*) [29])
                         ((ulong)((long)(this_02->Members).
                                        super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar29)
                         >> 7);
                (this_02->super_ShaderCodeVariableDesc).NumMembers = (Uint32)Args_1;
                (this_02->super_ShaderCodeVariableDesc).pMembers =
                     &pSVar29->super_ShaderCodeVariableDesc;
              }
              else {
                uVar16 = (pSVar21->super_ShaderCodeVariableDesc).ArraySize;
                uVar12 = iVar11 + 1U;
                if (iVar11 + 1U < uVar16) {
                  uVar12 = uVar16;
                }
                (pSVar21->super_ShaderCodeVariableDesc).ArraySize = uVar12;
                uVar16 = (pSVar23->super_ShaderCodeVariableDesc).Offset;
                Args_1 = (char (*) [29])(ulong)uVar16;
                if (uVar16 < (pSVar21->super_ShaderCodeVariableDesc).Offset) {
                  FormatString<char[26],char[29]>
                            (&local_1f8,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"Var.Offset >= pArray->Offset",Args_1);
                  Args_1 = (char (*) [29])0x19e;
                  DebugAssertionFailed
                            (local_1f8._M_dataplus._M_p,"PrepareUBReflection",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0x19e);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != paVar4) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
              }
              pSVar23 = pSVar23 + 1;
            } while (pSVar23 != local_2a0);
            local_198.Variables.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_230.
                 super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar30 = local_230.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_;
            uVar31 = local_230.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_;
            uVar32 = local_230.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_4_;
            uVar33 = local_230.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_finish._4_4_;
          }
          local_198.super_ShaderCodeBufferDesc.pVariables = (ShaderCodeVariableDesc *)0x0;
          local_198.super_ShaderCodeBufferDesc.NumVariables = 0;
          local_198.super_ShaderCodeBufferDesc.Size = local_f0;
          local_2d8._0_8_ = (pointer)0x0;
          local_2d8._8_8_ = (pointer)0x0;
          stack0xfffffffffffffd38 = 0;
          local_230.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_230.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_230.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_198.Variables.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar30;
          local_198.Variables.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar31;
          local_198.Variables.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = uVar32;
          local_198.Variables.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = uVar33;
          std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::~vector((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     *)local_2d8);
          local_198.super_ShaderCodeBufferDesc.pVariables =
               (ShaderCodeVariableDesc *)
               CONCAT44(local_198.Variables.
                        super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_198.Variables.
                        super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
          local_198.super_ShaderCodeBufferDesc.NumVariables =
               (int)((ulong)(CONCAT44(local_198.Variables.
                                      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      local_198.Variables.
                                      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                            (long)local_198.super_ShaderCodeBufferDesc.pVariables) >> 7);
          local_278 = local_230.
                      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_2d8._0_8_ =
               (long)local_230.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_230.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 7;
          uVar16 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_2d8);
          pcVar19 = local_70;
          local_288._12_4_ = uVar16;
          if (local_198.super_ShaderCodeBufferDesc.NumVariables != 0) {
            lVar24 = 0;
            uVar20 = 0;
            do {
              ProcessUBVariable((ShaderCodeVariableDescX *)
                                (CONCAT44(local_198.Variables.
                                          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_198.Variables.
                                          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar24)
                                ,0);
              uVar20 = uVar20 + 1;
              lVar24 = lVar24 + 0x80;
            } while (uVar20 < (ulong)local_198.super_ShaderCodeBufferDesc._0_8_ >> 0x20);
          }
          std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::~vector(&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_p != &local_240) {
            operator_delete(local_250._M_p,
                            CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_p != &local_260) {
            operator_delete(local_270._M_p,
                            CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]
                                    ) + 1);
          }
          std::
          vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
          ::emplace_back<Diligent::ShaderCodeBufferDescX>(&local_c8,&local_198);
          std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::~vector(&local_198.Variables);
        }
        pcVar19 = pcVar19 + 0x18;
      } while (pcVar19 != local_208);
    }
    RangeEnd = local_c8.
               super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    RangeStart = local_c8.
                 super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    RawAllocator = GetRawAllocator();
    ShaderCodeBufferDescX::
    PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
              ((ShaderCodeBufferDescX *)local_298,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeStart,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeEnd,RawAllocator);
    uVar7 = local_298._8_8_;
    this_00 = &local_f8->m_UBReflectionBuffer;
    local_298._8_8_ = (ShaderCodeVariableDesc *)0x0;
    ptr = (local_f8->m_UBReflectionBuffer)._M_t.
          super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
          super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
          super__Head_base<0UL,_void_*,_false>._M_head_impl;
    (local_f8->m_UBReflectionBuffer)._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)uVar7;
    if (ptr == (void *)0x0) {
      (this_00->_M_t).
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
      _M_head_impl = (STDDeleter<void,_Diligent::IMemoryAllocator>)local_298._0_8_;
    }
    else {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)this_00,ptr);
      (this_00->_M_t).
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
      _M_head_impl = (STDDeleter<void,_Diligent::IMemoryAllocator>)local_298._0_8_;
      local_298._0_8_ = (IMemoryAllocator *)0x0;
      if ((ShaderCodeVariableDesc *)local_298._8_8_ != (ShaderCodeVariableDesc *)0x0) {
        STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                  ((STDDeleter<void,_Diligent::IMemoryAllocator> *)local_298,(void *)local_298._8_8_
                  );
      }
    }
    std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
    ~vector(&local_c8);
  }
  if ((char (*) [30])
      local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char (*) [30])0x0) {
    operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ::~vector(&local_138);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_e8.
      super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.
      super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.
      super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.
      super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderResourcesGL::LoadUniforms(const LoadUniformsAttribs& Attribs)
{
    VERIFY(Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_NONE || Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER,
           "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags");

    // Load uniforms to temporary arrays. We will then pack all variables into a single chunk of memory.
    std::vector<UniformBufferInfo> UniformBlocks;
    std::vector<TextureInfo>       Textures;
    std::vector<ImageInfo>         Images;
    std::vector<StorageBlockInfo>  StorageBlocks;
    std::unordered_set<String>     NamesPool;

    // Linear list of unrolled uniform variables grouped by the uniform block index, e.g.:
    //   0: f4, u4, s1.f4[0]
    //   1: s2.s1.f4[0], s3.s2[0].s1.f4[1]
    std::vector<std::vector<ShaderCodeVariableDescX>> UniformVars;

    VERIFY(Attribs.GLProgram, "Null GL program");
    Attribs.State.SetProgram(Attribs.GLProgram);

    GLuint GLProgram = Attribs.GLProgram;
    m_ShaderStages   = Attribs.ShaderStages;

    GLint numActiveUniforms = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORMS, &numActiveUniforms);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniforms\n");

    // Query the maximum name length of the active uniform (including null terminator)
    GLint activeUniformMaxLength = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_MAX_LENGTH, &activeUniformMaxLength);
    DEV_CHECK_GL_ERROR("Unable to get the maximum uniform name length\n");

    GLint numActiveUniformBlocks = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCKS, &numActiveUniformBlocks);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniform blocks\n");

    //
    // #### This parameter is currently unsupported by Intel OGL drivers.
    //
    // Query the maximum name length of the active uniform block (including null terminator)
    GLint activeUniformBlockMaxLength = 0;
    // On Intel driver, this call might fail:
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, &activeUniformBlockMaxLength);
#ifdef DILIGENT_DEVELOPMENT
    if (glGetError() != GL_NO_ERROR)
    {
        LOG_WARNING_MESSAGE("Unable to get the maximum uniform block name length.");
    }
#endif

    if (activeUniformBlockMaxLength <= 0)
        activeUniformBlockMaxLength = 1024;

    auto MaxNameLength = std::max(activeUniformMaxLength, activeUniformBlockMaxLength);

#if GL_ARB_program_interface_query
    GLint numActiveShaderStorageBlocks = 0;
    if (glGetProgramInterfaceiv)
    {
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_ACTIVE_RESOURCES, &numActiveShaderStorageBlocks);
        DEV_CHECK_GL_ERROR("Unable to get the number of shader storage blocks\n");

        // Query the maximum name length of the active shader storage block (including null terminator)
        GLint MaxShaderStorageBlockNameLen = 0;
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_MAX_NAME_LENGTH, &MaxShaderStorageBlockNameLen);
        DEV_CHECK_GL_ERROR("Unable to get the maximum shader storage block name length\n");
        MaxNameLength = std::max(MaxNameLength, MaxShaderStorageBlockNameLen);
    }
#endif

    MaxNameLength = std::max(MaxNameLength, 512);
    std::vector<GLchar> Name(static_cast<size_t>(MaxNameLength) + 1);
    for (int i = 0; i < numActiveUniforms; i++)
    {
        GLenum dataType = 0;
        GLint  size     = 0;
        GLint  NameLen  = 0;
        // If one or more elements of an array are active, the name of the array is returned in 'name',
        // the type is returned in 'type', and the 'size' parameter returns the highest array element index used,
        // plus one, as determined by the compiler and/or linker.
        // Only one active uniform variable will be reported for a uniform array.
        // Uniform variables other than arrays will have a size of 1
        glGetActiveUniform(GLProgram, i, MaxNameLength, &NameLen, &size, &dataType, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform name");
        VERIFY(size >= 1, "Size is expected to be at least 1");
        // Note that
        // glGetActiveUniform( program, index, bufSize, length, size, type, name );
        //
        // is equivalent to
        //
        // const enum props[] = { ARRAY_SIZE, TYPE };
        // glGetProgramResourceName( program, UNIFORM, index, bufSize, length, name );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[0], 1, NULL, size );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[1], 1, NULL, (int *)type );
        //
        // The latter is only available in GL 4.4 and GLES 3.1

        RESOURCE_DIMENSION ResDim;
        bool               IsMS;
        GLTextureTypeToResourceDim(dataType, ResDim, IsMS);

        switch (dataType)
        {
            case GL_SAMPLER_1D:
            case GL_SAMPLER_2D:
            case GL_SAMPLER_3D:
            case GL_SAMPLER_CUBE:
            case GL_SAMPLER_1D_SHADOW:
            case GL_SAMPLER_2D_SHADOW:

            case GL_SAMPLER_1D_ARRAY:
            case GL_SAMPLER_2D_ARRAY:
            case GL_SAMPLER_1D_ARRAY_SHADOW:
            case GL_SAMPLER_2D_ARRAY_SHADOW:
            case GL_SAMPLER_CUBE_SHADOW:

            case GL_SAMPLER_EXTERNAL_OES:

            case GL_INT_SAMPLER_1D:
            case GL_INT_SAMPLER_2D:
            case GL_INT_SAMPLER_3D:
            case GL_INT_SAMPLER_CUBE:
            case GL_INT_SAMPLER_1D_ARRAY:
            case GL_INT_SAMPLER_2D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_1D:
            case GL_UNSIGNED_INT_SAMPLER_2D:
            case GL_UNSIGNED_INT_SAMPLER_3D:
            case GL_UNSIGNED_INT_SAMPLER_CUBE:
            case GL_UNSIGNED_INT_SAMPLER_1D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_ARRAY:

            case GL_SAMPLER_CUBE_MAP_ARRAY:
            case GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW:
            case GL_INT_SAMPLER_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY:

            case GL_SAMPLER_2D_MULTISAMPLE:
            case GL_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:

            case GL_SAMPLER_BUFFER:
            case GL_INT_SAMPLER_BUFFER:
            case GL_UNSIGNED_INT_SAMPLER_BUFFER:
            {
                const auto IsBuffer =
                    dataType == GL_SAMPLER_BUFFER ||
                    dataType == GL_INT_SAMPLER_BUFFER ||
                    dataType == GL_UNSIGNED_INT_SAMPLER_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_SRV :
                    SHADER_RESOURCE_TYPE_TEXTURE_SRV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    Attribs.SamplerResourceFlag // PIPELINE_RESOURCE_FLAG_NONE for HLSL source or
                                                // PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER for GLSL source
                    ;

                RemoveArrayBrackets(Name.data());

                Textures.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }

#if GL_ARB_shader_image_load_store
            case GL_IMAGE_1D:
            case GL_IMAGE_2D:
            case GL_IMAGE_3D:
            case GL_IMAGE_2D_RECT:
            case GL_IMAGE_CUBE:
            case GL_IMAGE_BUFFER:
            case GL_IMAGE_1D_ARRAY:
            case GL_IMAGE_2D_ARRAY:
            case GL_IMAGE_CUBE_MAP_ARRAY:
            case GL_IMAGE_2D_MULTISAMPLE:
            case GL_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_INT_IMAGE_1D:
            case GL_INT_IMAGE_2D:
            case GL_INT_IMAGE_3D:
            case GL_INT_IMAGE_2D_RECT:
            case GL_INT_IMAGE_CUBE:
            case GL_INT_IMAGE_BUFFER:
            case GL_INT_IMAGE_1D_ARRAY:
            case GL_INT_IMAGE_2D_ARRAY:
            case GL_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_INT_IMAGE_2D_MULTISAMPLE:
            case GL_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_1D:
            case GL_UNSIGNED_INT_IMAGE_2D:
            case GL_UNSIGNED_INT_IMAGE_3D:
            case GL_UNSIGNED_INT_IMAGE_2D_RECT:
            case GL_UNSIGNED_INT_IMAGE_CUBE:
            case GL_UNSIGNED_INT_IMAGE_BUFFER:
            case GL_UNSIGNED_INT_IMAGE_1D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            {
                const auto IsBuffer =
                    dataType == GL_IMAGE_BUFFER ||
                    dataType == GL_INT_IMAGE_BUFFER ||
                    dataType == GL_UNSIGNED_INT_IMAGE_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_UAV :
                    SHADER_RESOURCE_TYPE_TEXTURE_UAV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    PIPELINE_RESOURCE_FLAG_NONE;

                RemoveArrayBrackets(Name.data());

                Images.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }
#endif

            default:
                // Some other uniform type like scalar, matrix etc.
                if (Attribs.LoadUniformBufferReflection)
                {
                    auto VarDesc = GLDataTypeToShaderCodeVariableDesc(dataType);
                    if (VarDesc.BasicType != SHADER_CODE_BASIC_TYPE_UNKNOWN)
                    {
                        // All uniforms are reported as unrolled variables, e.g. s2.s1[1].f4[0]
                        VarDesc.Name = Name.data();
                        AddUniformBufferVariable(GLProgram, i, VarDesc, UniformVars, Attribs.SourceLang);
                    }
                }
                break;
        }
    }

    for (int i = 0; i < numActiveUniformBlocks; i++)
    {
        // In contrast to shader uniforms, every element in uniform block array is enumerated individually
        GLsizei NameLen = 0;
        glGetActiveUniformBlockName(GLProgram, i, MaxNameLength, &NameLen, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block name\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform block name");

        // glGetActiveUniformBlockName( program, uniformBlockIndex, bufSize, length, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceName(program, GL_UNIFORM_BLOCK, uniformBlockIndex, bufSize, length, uniformBlockName);

        auto UniformBlockIndex = glGetUniformBlockIndex(GLProgram, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block index\n");
        // glGetUniformBlockIndex( program, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceIndex( program, GL_UNIFORM_BLOCK, uniformBlockName );

        bool IsNewBlock = true;

        GLint ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!UniformBlocks.empty())
            {
                // Look at previous uniform block to check if it is the same array
                auto& LastBlock = UniformBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(UniformBlockIndex == LastBlock.UBIndex + Ind, "Uniform block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#ifdef DILIGENT_DEBUG
                    for (const auto& ub : UniformBlocks)
                        VERIFY(strcmp(ub.Name, Name.data()) != 0, "Uniform block with the name '", ub.Name, "' has already been enumerated");
#endif
                }
            }
        }

        if (IsNewBlock)
        {
            UniformBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_CONSTANT_BUFFER,
                static_cast<Uint32>(ArraySize),
                UniformBlockIndex //
            );
        }
    }

#if GL_ARB_shader_storage_buffer_object
    for (int i = 0; i < numActiveShaderStorageBlocks; ++i)
    {
        GLsizei Length = 0;
        glGetProgramResourceName(GLProgram, GL_SHADER_STORAGE_BLOCK, i, MaxNameLength, &Length, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block name\n");
        VERIFY(Length < MaxNameLength && static_cast<size_t>(Length) == strlen(Name.data()), "Incorrect shader storage block name");

        auto SBIndex = glGetProgramResourceIndex(GLProgram, GL_SHADER_STORAGE_BLOCK, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block index\n");

        bool  IsNewBlock     = true;
        Int32 ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!StorageBlocks.empty())
            {
                // Look at previous storage block to check if it is the same array
                auto& LastBlock = StorageBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(static_cast<GLint>(SBIndex) == LastBlock.SBIndex + Ind, "Storage block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#    ifdef DILIGENT_DEBUG
                    for (const auto& sb : StorageBlocks)
                        VERIFY(strcmp(sb.Name, Name.data()) != 0, "Storage block with the name \"", sb.Name, "\" has already been enumerated");
#    endif
                }
            }
        }

        if (IsNewBlock)
        {
            StorageBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_BUFFER_UAV,
                static_cast<Uint32>(ArraySize),
                SBIndex //
            );
        }
    }
#endif

    Attribs.State.SetProgram(GLObjectWrappers::GLProgramObj::Null());

    AllocateResources(UniformBlocks, Textures, Images, StorageBlocks);

    if (!UniformVars.empty())
    {
        VERIFY_EXPR(Attribs.LoadUniformBufferReflection);

        std::vector<ShaderCodeBufferDescX> UBReflections;
        for (const auto& UB : UniformBlocks)
        {
            if (UB.UBIndex < UniformVars.size())
            {
                auto& Vars = UniformVars[UB.UBIndex];

                GLint BufferSize = 0;
                glGetActiveUniformBlockiv(GLProgram, UB.UBIndex, GL_UNIFORM_BLOCK_DATA_SIZE, &BufferSize);
                DEV_CHECK_GL_ERROR("Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter");

                UBReflections.emplace_back(PrepareUBReflection(std::move(Vars), StaticCast<Uint32>(BufferSize)));
            }
            else
            {
                UNEXPECTED("Uniform block ", UB.UBIndex, " has no variables.");
            }
        }

        m_UBReflectionBuffer = ShaderCodeBufferDescX::PackArray(UBReflections.cbegin(), UBReflections.cend(), GetRawAllocator());
    }
}